

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FullSegment.hpp
# Opt level: O1

void __thiscall
cppjieba::FullSegment::Cut
          (FullSegment *this,string *sentence,
          vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *words)

{
  ulong uVar1;
  long lVar2;
  Range RVar3;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> wrs;
  PreFilter pre_filter;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> local_1e8;
  Word local_1c8;
  PreFilter local_198;
  
  PreFilter::PreFilter(&local_198,&(this->super_SegmentBase).symbols_,sentence);
  local_1e8.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::reserve
            (&local_1e8,sentence->_M_string_length >> 1);
  while (local_198.cursor_ != local_198.sentence_.ptr_ + local_198.sentence_.size_) {
    RVar3 = PreFilter::Next(&local_198);
    Cut(this,RVar3.begin,RVar3.end,&local_1e8);
  }
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::_M_erase_at_end
            (words,(words->super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>).
                   _M_impl.super__Vector_impl_data._M_start);
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::reserve
            (words,(long)local_1e8.
                         super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1e8.
                         super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4);
  if (local_1e8.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_1e8.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar2 = 8;
    uVar1 = 0;
    do {
      GetWordFromRunes(&local_1c8,sentence,
                       *(const_iterator *)
                        ((long)local_1e8.
                               super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar2 + -8),
                       *(const_iterator *)
                        ((long)&(local_1e8.
                                 super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->left + lVar2));
      std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::emplace_back<cppjieba::Word>
                (words,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8.word._M_dataplus._M_p != &local_1c8.word.field_2) {
        operator_delete(local_1c8.word._M_dataplus._M_p,
                        local_1c8.word.field_2._M_allocated_capacity + 1);
      }
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (uVar1 < (ulong)((long)local_1e8.
                                   super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_1e8.
                                   super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  if (local_1e8.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.
                    super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.
                          super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.
                          super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((RuneStrArray *)local_198.sentence_.ptr_ != &local_198.sentence_) {
    free(local_198.sentence_.ptr_);
  }
  return;
}

Assistant:

void Cut(const string& sentence, 
        vector<Word>& words) const {
    PreFilter pre_filter(symbols_, sentence);
    PreFilter::Range range;
    vector<WordRange> wrs;
    wrs.reserve(sentence.size()/2);
    while (pre_filter.HasNext()) {
      range = pre_filter.Next();
      Cut(range.begin, range.end, wrs);
    }
    words.clear();
    words.reserve(wrs.size());
    GetWordsFromWordRanges(sentence, wrs, words);
  }